

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::TiledInputFile::initialize(TiledInputFile *this)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  size_t __n;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  bool bVar4;
  int iVar5;
  Format FVar6;
  string *psVar7;
  ArgExc *this_00;
  TileDescription *pTVar8;
  LineOrder *pLVar9;
  Box2i *pBVar10;
  size_t sVar11;
  TileBuffer *pTVar12;
  Compression *pCVar13;
  Compressor *compressor;
  pointer ppTVar14;
  char *pcVar15;
  Data *pDVar16;
  ulong uVar17;
  TileOffsets local_70;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_48;
  
  pDVar16 = this->_data;
  if ((pDVar16->version & 0x1a00U) == 0x200) {
    bVar4 = Header::hasType(&pDVar16->header);
    pDVar16 = this->_data;
    if (bVar4) {
      Header::setType(&pDVar16->header,(string *)&TILEDIMAGE_abi_cxx11_);
      pDVar16 = this->_data;
    }
  }
  if (pDVar16->partNumber == -1) {
    if ((pDVar16->version & 0x200) != 0) goto LAB_0014a14d;
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "Expected a tiled file but the file is not tiled.";
  }
  else {
    bVar4 = Header::hasType(&pDVar16->header);
    if (!bVar4) goto LAB_0014a14d;
    psVar7 = Header::type_abi_cxx11_(&this->_data->header);
    __n = psVar7->_M_string_length;
    if (__n == DAT_003d08a0) {
      if (__n == 0) {
LAB_0014a14d:
        Header::sanityCheck(&this->_data->header,true,false);
        pTVar8 = Header::tileDescription(&this->_data->header);
        pDVar16 = this->_data;
        uVar1 = pTVar8->ySize;
        LVar2 = pTVar8->mode;
        LVar3 = pTVar8->roundingMode;
        (pDVar16->tileDesc).xSize = pTVar8->xSize;
        (pDVar16->tileDesc).ySize = uVar1;
        (pDVar16->tileDesc).mode = LVar2;
        (pDVar16->tileDesc).roundingMode = LVar3;
        pLVar9 = Header::lineOrder(&this->_data->header);
        pDVar16 = this->_data;
        pDVar16->lineOrder = *pLVar9;
        pBVar10 = Header::dataWindow(&pDVar16->header);
        iVar5 = (pBVar10->min).x;
        pDVar16 = this->_data;
        pDVar16->minX = iVar5;
        maxX = (pBVar10->max).x;
        pDVar16->maxX = maxX;
        minY = (pBVar10->min).y;
        pDVar16->minY = minY;
        maxY = (pBVar10->max).y;
        pDVar16->maxY = maxY;
        precalculateTileInfo
                  (&pDVar16->tileDesc,iVar5,maxX,minY,maxY,&pDVar16->numXTiles,&pDVar16->numYTiles,
                   &pDVar16->numXLevels,&pDVar16->numYLevels);
        sVar11 = calculateBytesPerPixel(&this->_data->header);
        pDVar16 = this->_data;
        pDVar16->bytesPerPixel = sVar11;
        uVar1 = (pDVar16->tileDesc).ySize;
        sVar11 = (pDVar16->tileDesc).xSize * sVar11;
        pDVar16->maxBytesPerTileLine = sVar11;
        pDVar16->tileBufferSize = uVar1 * sVar11;
        if ((pDVar16->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pDVar16->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar17 = 0;
          do {
            pTVar12 = (TileBuffer *)operator_new(0x80);
            pCVar13 = Header::compression(&pDVar16->header);
            pDVar16 = this->_data;
            compressor = newTileCompressor(*pCVar13,pDVar16->maxBytesPerTileLine,
                                           (ulong)(pDVar16->tileDesc).ySize,&pDVar16->header);
            pTVar12->uncompressedData = (char *)0x0;
            pTVar12->buffer = (char *)0x0;
            pTVar12->dataSize = 0;
            pTVar12->compressor = compressor;
            FVar6 = defaultFormat(compressor);
            pTVar12->format = FVar6;
            pTVar12->dx = -1;
            pTVar12->dy = -1;
            pTVar12->lx = -1;
            pTVar12->ly = -1;
            pTVar12->hasException = false;
            (pTVar12->exception)._M_dataplus._M_p = (pointer)&(pTVar12->exception).field_2;
            (pTVar12->exception)._M_string_length = 0;
            (pTVar12->exception).field_2._M_local_buf[0] = '\0';
            IlmThread_2_5::Semaphore::Semaphore(&pTVar12->_sem,1);
            (this->_data->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar17] = pTVar12;
            iVar5 = (*this->_data->_streamData->is->_vptr_IStream[2])();
            pDVar16 = this->_data;
            if ((char)iVar5 == '\0') {
              pcVar15 = (char *)operator_new__(pDVar16->tileBufferSize);
              ppTVar14 = (pDVar16->tileBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppTVar14[uVar17]->buffer = pcVar15;
            }
            else {
              ppTVar14 = (pDVar16->tileBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < (ulong)((long)(pDVar16->tileBuffers).
                                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar14 >> 3));
        }
        TileOffsets::TileOffsets
                  (&local_70,(pDVar16->tileDesc).mode,pDVar16->numXLevels,pDVar16->numYLevels,
                   pDVar16->numXTiles,pDVar16->numYTiles);
        pDVar16 = this->_data;
        (pDVar16->tileOffsets)._numYLevels = local_70._numYLevels;
        (pDVar16->tileOffsets)._mode = local_70._mode;
        (pDVar16->tileOffsets)._numXLevels = local_70._numXLevels;
        local_48.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pDVar16->tileOffsets)._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pDVar16->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pDVar16->tileOffsets)._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pDVar16->tileOffsets)._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pDVar16->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pDVar16->tileOffsets)._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_70._offsets.
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_70._offsets.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_48);
        std::
        vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_70._offsets);
        return;
      }
      iVar5 = bcmp((psVar7->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
      if (iVar5 == 0) goto LAB_0014a14d;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "TiledInputFile used for non-tiledimage part.";
  }
  Iex_2_5::ArgExc::ArgExc(this_00,pcVar15);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
TiledInputFile::initialize ()
{
    // fix bad types in header (arises when a tool built against an older version of
    // OpenEXR converts a scanline image to tiled)
    // only applies when file is a single part, regular image, tiled file
    //
    if(!isMultiPart(_data->version) &&
       !isNonImage(_data->version) && 
       isTiled(_data->version) && 
       _data->header.hasType() )
    {
        _data->header.setType(TILEDIMAGE);
    }
    
    if (_data->partNumber == -1)
    {
        if (!isTiled (_data->version))
            throw IEX_NAMESPACE::ArgExc ("Expected a tiled file but the file is not tiled.");
        
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()!=TILEDIMAGE)
        {
            throw IEX_NAMESPACE::ArgExc ("TiledInputFile used for non-tiledimage part.");
        }
    }
    
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //
    
    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);    

    _data->bytesPerPixel = calculateBytesPerPixel (_data->header);

    _data->maxBytesPerTileLine = _data->bytesPerPixel * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        if (!_data->_streamData->is->isMemoryMapped ())
            _data->tileBuffers[i]->buffer = new char [_data->tileBufferSize];
    }

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}